

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QString * __thiscall
QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<QString_&,_QLatin1String> *this)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  iterator d;
  QChar *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->b).m_data == (char *)0x0 && (this->a->d).ptr == (char16_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_001f2cc4:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = (this->b).m_size;
    lVar2 = (this->a->d).size;
    (__return_storage_ptr__->d).size = -0x5555555555555556;
    (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar1 + lVar2,Uninitialized);
    local_20 = (QChar *)(__return_storage_ptr__->d).ptr;
    QConcatenable<QStringBuilder<QString_&,_QLatin1String>_>::appendTo<QChar>(this,&local_20);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_001f2cc4;
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }